

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O2

UniquePtr<EC_GROUP> GetCurve(FileTest *t,char *key)

{
  bool bVar1;
  _Head_base<0UL,_FileTest::LineReader_*,_false> _Var2;
  AssertHelper local_60;
  string local_58;
  string curve_name;
  
  curve_name._M_dataplus._M_p = (pointer)&curve_name.field_2;
  curve_name._M_string_length = 0;
  curve_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Curve",(allocator<char> *)&local_60);
  bVar1 = FileTest::GetAttribute((FileTest *)key,&curve_name,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    bVar1 = std::operator==(&curve_name,"P-224");
    if (bVar1) {
      _Var2._M_head_impl = (LineReader *)EC_group_p224();
    }
    else {
      bVar1 = std::operator==(&curve_name,"P-256");
      if (bVar1) {
        _Var2._M_head_impl = (LineReader *)EC_group_p256();
      }
      else {
        bVar1 = std::operator==(&curve_name,"P-384");
        if (bVar1) {
          _Var2._M_head_impl = (LineReader *)EC_group_p384();
        }
        else {
          bVar1 = std::operator==(&curve_name,"P-521");
          if (!bVar1) {
            bVar1 = std::operator==(&curve_name,"secp160r1");
            if (bVar1) {
              NewSecp160r1Group();
              goto LAB_002b7006;
            }
            testing::Message::Message((Message *)&local_58);
            std::operator<<((ostream *)(local_58._M_dataplus._M_p + 0x10),"Unknown curve: ");
            std::operator<<((ostream *)(local_58._M_dataplus._M_p + 0x10),(string *)&curve_name);
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                       ,0x136,"Failed");
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
            }
            goto LAB_002b7001;
          }
          _Var2._M_head_impl = (LineReader *)EC_group_p521();
        }
      }
    }
  }
  else {
LAB_002b7001:
    _Var2._M_head_impl = (LineReader *)0x0;
  }
  (t->reader_)._M_t.
  super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t.
  super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
  super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl = _Var2._M_head_impl;
LAB_002b7006:
  std::__cxx11::string::~string((string *)&curve_name);
  return (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)t;
}

Assistant:

static bssl::UniquePtr<EC_GROUP> GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p224()));
  }
  if (curve_name == "P-256") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p256()));
  }
  if (curve_name == "P-384") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p384()));
  }
  if (curve_name == "P-521") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p521()));
  }
  if (curve_name == "secp160r1") {
    return NewSecp160r1Group();
  }

  ADD_FAILURE() << "Unknown curve: " << curve_name;
  return nullptr;
}